

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int IoCommandWriteHie(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  
  glo_fMapped = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"mh");
    if (iVar1 != 0x6d) break;
    glo_fMapped = glo_fMapped ^ 1;
  }
  if (iVar1 == -1) {
    if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
      fwrite("Empty network.\n",0xf,1,(FILE *)pAbc->Out);
    }
    else {
      if (globalUtilOptind + 2 != argc) goto LAB_0028c3c8;
      Io_WriteHie(pAbc->pNtkCur,argv[globalUtilOptind],argv[(long)globalUtilOptind + 1]);
    }
    iVar1 = 0;
  }
  else {
LAB_0028c3c8:
    fwrite("usage: write_hie [-h] <orig> <file>\n",0x24,1,(FILE *)pAbc->Err);
    fwrite("\t         writes the current network into <file> by calling\n",0x3c,1,(FILE *)pAbc->Err
          );
    fwrite("\t         the hierarchical writer that matches the extension of <file>\n",0x47,1,
           (FILE *)pAbc->Err);
    pcVar2 = "yes";
    if (glo_fMapped == 0) {
      pcVar2 = "no";
    }
    fprintf((FILE *)pAbc->Err,"\t-m     : toggle reading mapped Verilog for <orig> [default = %s]\n"
            ,pcVar2);
    fwrite("\t-h     : print the help massage\n",0x21,1,(FILE *)pAbc->Err);
    fwrite("\torig   : the name of the original file with the hierarchical design\n",0x45,1,
           (FILE *)pAbc->Err);
    fwrite("\tfile   : the name of the file to write\n",0x28,1,(FILE *)pAbc->Err);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int IoCommandWriteHie( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pBaseName, * pFileName;
    int c;

    glo_fMapped = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "mh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'm':
                glo_fMapped ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pNtkCur == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 2 )
        goto usage;
    // get the output file name
    pBaseName = argv[globalUtilOptind];
    pFileName = argv[globalUtilOptind+1];
    // call the corresponding file writer
//    Io_Write( pAbc->pNtkCur, pFileName, Io_ReadFileType(pFileName) );
    Io_WriteHie( pAbc->pNtkCur, pBaseName, pFileName );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_hie [-h] <orig> <file>\n" );
    fprintf( pAbc->Err, "\t         writes the current network into <file> by calling\n" );
    fprintf( pAbc->Err, "\t         the hierarchical writer that matches the extension of <file>\n" );
    fprintf( pAbc->Err, "\t-m     : toggle reading mapped Verilog for <orig> [default = %s]\n", glo_fMapped? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\torig   : the name of the original file with the hierarchical design\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write\n" );
    return 1;
}